

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O3

void compute_deriv(qnode_ptr_t c,qnode_ptr_t f)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  param512_t *papVar5;
  int iVar6;
  qnode_ptr_t ptVar7;
  float *pfVar8;
  qnode_ptr_t ptVar9;
  qnode_ptr_t ptVar10;
  int iVar11;
  int iVar12;
  int y;
  long lVar13;
  qnode_ptr_t ptVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  
  iVar16 = f->sizy;
  uVar1 = f->ofst;
  ptVar7 = (qnode_ptr_t)(ulong)uVar1;
  uVar3 = iVar16 - uVar1;
  ptVar10 = f;
  ptVar9 = ptVar7;
  if ((int)uVar1 < (int)uVar3) {
    iVar2 = f->sizx;
    do {
      iVar11 = (int)ptVar7;
      if ((int)ptVar9 < iVar2 - (int)ptVar9) {
        uVar4 = (ulong)(uint)f->sizz;
        ptVar7 = ptVar9;
        do {
          iVar16 = (int)ptVar7;
          if (0 < (int)uVar4) {
            lVar13 = 0;
            do {
              fVar17 = dx(c,f,iVar11,iVar16,(int)lVar13);
              (*f->param_ptr[lVar13])[f->res * iVar11 + iVar16].fx = fVar17;
              ptVar10 = f;
              fVar17 = dy(c,f,iVar11,iVar16,(int)lVar13);
              (*f->param_ptr[lVar13])[f->res * iVar11 + iVar16].fy = fVar17;
              lVar13 = lVar13 + 1;
              uVar4 = (ulong)f->sizz;
            } while (lVar13 < (long)uVar4);
            iVar2 = f->sizx;
            ptVar9 = (qnode_ptr_t)(ulong)(uint)f->ofst;
          }
          ptVar7 = (qnode_ptr_t)(ulong)(iVar16 + 1U);
        } while ((int)(iVar16 + 1U) < iVar2 - (int)ptVar9);
        iVar16 = f->sizy;
      }
      ptVar7 = (qnode_ptr_t)(ulong)(iVar11 + 1U);
      uVar3 = iVar16 - (int)ptVar9;
    } while ((int)(iVar11 + 1U) < (int)uVar3);
  }
  iVar2 = (int)((double)c->sizz * 0.5);
  iVar11 = (int)ptVar9;
  if (iVar11 < (int)uVar3) {
    iVar6 = f->sizx;
    ptVar7 = ptVar9;
    do {
      iVar12 = (int)ptVar7;
      if (iVar11 < iVar6 - iVar11) {
        pfVar8 = &(*f->param_ptr[iVar2])[(long)iVar12 * (long)f->res + (long)iVar11].ft;
        ptVar14 = ptVar9;
        iVar15 = iVar6 + iVar11 * -2;
        do {
          y = (int)ptVar14;
          if (pfVar8[8] == 0.0) {
            fVar17 = dt(c,ptVar10,iVar12,y);
            *pfVar8 = fVar17;
            fVar17 = dxt(f,iVar12,y);
            pfVar8[1] = fVar17;
            ptVar10 = ptVar7;
            fVar17 = dyt(f,iVar12,y);
            pfVar8[2] = fVar17;
          }
          ptVar14 = (qnode_ptr_t)(ulong)(y + 1);
          pfVar8 = pfVar8 + 0xc;
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
      }
      ptVar7 = (qnode_ptr_t)(ulong)(iVar12 + 1U);
    } while (iVar12 + 1U != uVar3);
  }
  if (iVar11 < iVar16 - iVar11) {
    iVar11 = f->sizx;
    ptVar10 = ptVar9;
    do {
      iVar12 = (int)ptVar10;
      iVar6 = (int)ptVar9;
      if (iVar12 < iVar11 - iVar12) {
        papVar5 = f->param_ptr[iVar2];
        iVar16 = f->res;
        lVar13 = (long)iVar12;
        do {
          if ((*papVar5)[iVar6 * iVar16 + lVar13].err == 0) {
            iVar16 = (int)lVar13;
            fVar17 = dxx(f,iVar6,iVar16,iVar2);
            (*f->param_ptr[iVar2])[(long)f->res * (long)iVar6 + lVar13].fxx = fVar17;
            fVar17 = dyy(f,iVar6,iVar16,iVar2);
            (*f->param_ptr[iVar2])[(long)f->res * (long)iVar6 + lVar13].fyy = fVar17;
            fVar17 = dxy(f,iVar6,iVar16,iVar2);
            papVar5 = f->param_ptr[iVar2];
            iVar16 = f->res;
            (*papVar5)[iVar6 * iVar16 + lVar13].fxy = fVar17;
            iVar11 = f->sizx;
            ptVar10 = (qnode_ptr_t)(ulong)(uint)f->ofst;
          }
          lVar13 = lVar13 + 1;
        } while ((int)lVar13 < iVar11 - (int)ptVar10);
        iVar16 = f->sizy;
      }
      ptVar9 = (qnode_ptr_t)(ulong)(iVar6 + 1U);
    } while ((int)(iVar6 + 1U) < iVar16 - (int)ptVar10);
  }
  return;
}

Assistant:

void compute_deriv(c,f)
qnode_ptr_t c, f ;

{ float dxx(), dyy(), dxy(), dx(), dy(), dt(), dxt(), dyt() ;
  int i, j, k ;
param_t P ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      for (k = 0 ; k < f->sizz ; k++) {
        (*f->param_ptr[k])[f->res*i + j].fx = dx(c,f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fy = dy(c,f,i,j,k) ;
      }
    }
  }
  k = c->sizz/2.0 ;
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].ft = dt(c,f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fxt = dxt(f,i,j) ;
        (*f->param_ptr[k])[f->res*i + j].fyt = dyt(f,i,j) ;
      }
    }
  }
  for (i = f->ofst ; i < f->sizy - f->ofst ; i++) {
    for (j = f->ofst ; j < f->sizx - f->ofst ; j++) {
      if ((*f->param_ptr[k])[f->res*i + j].err == NO_ERROR) {
        (*f->param_ptr[k])[f->res*i + j].fxx = dxx(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fyy = dyy(f,i,j,k) ;
        (*f->param_ptr[k])[f->res*i + j].fxy = dxy(f,i,j,k) ;
      }
    }
  }
}